

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compress_frameChunk
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                 U32 lastFrameChunk)

{
  U32 maxDist_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  void *src_00;
  ZSTD_CCtx *in_RCX;
  ulong in_RDX;
  ZSTD_CCtx *in_RSI;
  undefined4 *in_RDI;
  ZSTD_matchState_t *in_R8;
  uint in_R9D;
  U32 cBlockHeader;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  size_t cSize;
  U32 lastBlock;
  ZSTD_matchState_t *ms;
  U32 maxDist;
  BYTE *op;
  BYTE *ostart;
  BYTE *ip;
  size_t remaining;
  size_t blockSize;
  size_t in_stack_000000e0;
  void *in_stack_000000e8;
  XXH64_state_t *in_stack_000000f0;
  U32 local_a8;
  U32 in_stack_ffffffffffffff5c;
  void *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  U32 lastBlock_00;
  undefined4 in_stack_ffffffffffffff88;
  ZSTD_window_t *window;
  undefined4 in_stack_ffffffffffffff98;
  ZSTD_CCtx *zc;
  ZSTD_matchState_t *params;
  undefined4 in_stack_ffffffffffffffc8;
  ZSTD_matchState_t *ms_00;
  ZSTD_CCtx *zc_00;
  ulong local_20;
  
  params = *(ZSTD_matchState_t **)(in_RDI + 0xbc);
  maxDist_00 = 1 << ((byte)in_RDI[0x3b] & 0x1f);
  local_a8 = in_stack_ffffffffffffff5c;
  zc = in_RSI;
  ms_00 = in_R8;
  zc_00 = in_RCX;
  local_20 = in_RDX;
  if ((in_RDI[0x43] != 0) && (in_R8 != (ZSTD_matchState_t *)0x0)) {
    XXH64_update(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
    local_a8 = in_stack_ffffffffffffff5c;
  }
  do {
    lastBlock_00 = (U32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if (in_R8 == (ZSTD_matchState_t *)0x0) {
      if ((in_R9D != 0) && (zc < in_RSI)) {
        *in_RDI = 3;
      }
      return (size_t)(void *)((long)in_RSI - (long)zc);
    }
    window = (ZSTD_window_t *)(in_RDI + 0x324);
    uVar1 = in_R9D & in_R8 <= params;
    if (local_20 < 6) {
      return (size_t)(void *)0xffffffffffffffba;
    }
    if (in_R8 < params) {
      params = in_R8;
    }
    ZSTD_overflowCorrectIfNeeded
              (ms_00,(ZSTD_cwksp *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
               (ZSTD_CCtx_params *)params,in_R8,in_RCX);
    ZSTD_checkDictValidity
              (window,(BYTE *)((long)params->hashCache +
                              (long)(in_RCX[-1].blockSplitCtx.entropyMetadata.fseMetadata.
                                     fseTablesBuffer + 0x6c)),maxDist_00,(U32 *)(window + 1),
               (ZSTD_matchState_t **)&window[6].base);
    ZSTD_window_enforceMaxDist
              (window,in_RCX,maxDist_00,(U32 *)(window + 1),(ZSTD_matchState_t **)&window[6].base);
    if (*(uint *)((long)&window[1].nextSrc + 4) < window->lowLimit) {
      *(U32 *)((long)&window[1].nextSrc + 4) = window->lowLimit;
    }
    iVar2 = ZSTD_useTargetCBlockSize((ZSTD_CCtx_params *)(in_RDI + 0x3a));
    if (iVar2 == 0) {
      iVar2 = ZSTD_blockSplitterEnabled((ZSTD_CCtx_params *)(in_RDI + 0x3a));
      if (iVar2 != 0) {
        pvVar4 = (void *)ZSTD_compressBlock_splitBlock
                                   (zc,in_RSI,CONCAT44(maxDist_00,in_stack_ffffffffffffff98),window,
                                    CONCAT44(uVar1,in_stack_ffffffffffffff88),lastBlock_00);
        in_stack_ffffffffffffff80 = pvVar4;
        uVar1 = ERR_isError((size_t)pvVar4);
        in_stack_ffffffffffffff70 = pvVar4;
        goto joined_r0x008a7af7;
      }
      src_00 = (void *)ZSTD_compressBlock_internal
                                 (zc_00,ms_00,CONCAT44(in_R9D,in_stack_ffffffffffffffc8),params,
                                  (size_t)in_R8,(U32)((ulong)in_RCX >> 0x20));
      pvVar4 = src_00;
      uVar3 = ERR_isError((size_t)src_00);
      if (uVar3 != 0) {
        return (size_t)src_00;
      }
      if (pvVar4 == (void *)0x0) {
        in_stack_ffffffffffffff60 =
             (void *)ZSTD_noCompressBlock
                               (in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70,src_00,
                                (size_t)in_stack_ffffffffffffff60,local_a8);
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff60;
        uVar1 = ERR_isError((size_t)in_stack_ffffffffffffff60);
        pvVar4 = in_stack_ffffffffffffff60;
        goto joined_r0x008a7af7;
      }
      if (pvVar4 == (void *)0x1) {
        local_a8 = uVar1 + 2 + (int)((long)params << 3);
      }
      else {
        local_a8 = uVar1 + 4 + (int)((long)pvVar4 << 3);
      }
      MEM_writeLE24(in_stack_ffffffffffffff60,local_a8);
      in_stack_ffffffffffffff80 = (void *)((long)pvVar4 + 3);
    }
    else {
      in_stack_ffffffffffffff78 =
           (void *)ZSTD_compressBlock_targetCBlockSize
                             (zc,in_RSI,CONCAT44(maxDist_00,in_stack_ffffffffffffff98),window,
                              CONCAT44(uVar1,in_stack_ffffffffffffff88),lastBlock_00);
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff78;
      uVar1 = ERR_isError((size_t)in_stack_ffffffffffffff78);
      pvVar4 = in_stack_ffffffffffffff78;
joined_r0x008a7af7:
      if (uVar1 != 0) {
        return (size_t)pvVar4;
      }
    }
    in_RCX = (ZSTD_CCtx *)
             ((long)((ZSTD_matchState_t *)(params->hashCache + -0x10))->hashCache +
             (long)(in_RCX[-1].blockSplitCtx.entropyMetadata.fseMetadata.fseTablesBuffer + 0x6c));
    in_R8 = (ZSTD_matchState_t *)((long)in_R8 - (long)params);
    in_RSI = (ZSTD_CCtx *)((long)in_stack_ffffffffffffff80 + (long)in_RSI);
    local_20 = local_20 - (long)in_stack_ffffffffffffff80;
    in_RDI[0xec] = 0;
  } while( true );
}

Assistant:

static size_t ZSTD_compress_frameChunk(ZSTD_CCtx* cctx,
                                     void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                                     U32 lastFrameChunk)
{
    size_t blockSize = cctx->blockSize;
    size_t remaining = srcSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* op = ostart;
    U32 const maxDist = (U32)1 << cctx->appliedParams.cParams.windowLog;

    assert(cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX);

    DEBUGLOG(4, "ZSTD_compress_frameChunk (blockSize=%u)", (unsigned)blockSize);
    if (cctx->appliedParams.fParams.checksumFlag && srcSize)
        XXH64_update(&cctx->xxhState, src, srcSize);

    while (remaining) {
        ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
        U32 const lastBlock = lastFrameChunk & (blockSize >= remaining);

        /* TODO: See 3090. We reduced MIN_CBLOCK_SIZE from 3 to 2 so to compensate we are adding
         * additional 1. We need to revisit and change this logic to be more consistent */
        RETURN_ERROR_IF(dstCapacity < ZSTD_blockHeaderSize + MIN_CBLOCK_SIZE + 1,
                        dstSize_tooSmall,
                        "not enough space to store compressed block");
        if (remaining < blockSize) blockSize = remaining;

        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams, ip, ip + blockSize);
        ZSTD_checkDictValidity(&ms->window, ip + blockSize, maxDist, &ms->loadedDictEnd, &ms->dictMatchState);
        ZSTD_window_enforceMaxDist(&ms->window, ip, maxDist, &ms->loadedDictEnd, &ms->dictMatchState);

        /* Ensure hash/chain table insertion resumes no sooner than lowlimit */
        if (ms->nextToUpdate < ms->window.lowLimit) ms->nextToUpdate = ms->window.lowLimit;

        {   size_t cSize;
            if (ZSTD_useTargetCBlockSize(&cctx->appliedParams)) {
                cSize = ZSTD_compressBlock_targetCBlockSize(cctx, op, dstCapacity, ip, blockSize, lastBlock);
                FORWARD_IF_ERROR(cSize, "ZSTD_compressBlock_targetCBlockSize failed");
                assert(cSize > 0);
                assert(cSize <= blockSize + ZSTD_blockHeaderSize);
            } else if (ZSTD_blockSplitterEnabled(&cctx->appliedParams)) {
                cSize = ZSTD_compressBlock_splitBlock(cctx, op, dstCapacity, ip, blockSize, lastBlock);
                FORWARD_IF_ERROR(cSize, "ZSTD_compressBlock_splitBlock failed");
                assert(cSize > 0 || cctx->seqCollector.collectSequences == 1);
            } else {
                cSize = ZSTD_compressBlock_internal(cctx,
                                        op+ZSTD_blockHeaderSize, dstCapacity-ZSTD_blockHeaderSize,
                                        ip, blockSize, 1 /* frame */);
                FORWARD_IF_ERROR(cSize, "ZSTD_compressBlock_internal failed");

                if (cSize == 0) {  /* block is not compressible */
                    cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, blockSize, lastBlock);
                    FORWARD_IF_ERROR(cSize, "ZSTD_noCompressBlock failed");
                } else {
                    U32 const cBlockHeader = cSize == 1 ?
                        lastBlock + (((U32)bt_rle)<<1) + (U32)(blockSize << 3) :
                        lastBlock + (((U32)bt_compressed)<<1) + (U32)(cSize << 3);
                    MEM_writeLE24(op, cBlockHeader);
                    cSize += ZSTD_blockHeaderSize;
                }
            }  /* if (ZSTD_useTargetCBlockSize(&cctx->appliedParams))*/


            ip += blockSize;
            assert(remaining >= blockSize);
            remaining -= blockSize;
            op += cSize;
            assert(dstCapacity >= cSize);
            dstCapacity -= cSize;
            cctx->isFirstBlock = 0;
            DEBUGLOG(5, "ZSTD_compress_frameChunk: adding a block of size %u",
                        (unsigned)cSize);
    }   }

    if (lastFrameChunk && (op>ostart)) cctx->stage = ZSTDcs_ending;
    return (size_t)(op-ostart);
}